

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::SecretManager::TryLookupTypeInternal(SecretManager *this,string *type,SecretType *type_out)

{
  iterator iVar1;
  bool bVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->manager_lock;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->secret_types)._M_h,type);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
      ._M_cur == (__node_type *)0x0) {
    ::std::unique_lock<std::mutex>::unlock(&local_40);
    AutoloadExtensionForType(this,type);
    ::std::unique_lock<std::mutex>::lock(&local_40);
    iVar1 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->secret_types)._M_h,type);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
        ._M_cur == (__node_type *)0x0) {
      bVar2 = false;
      goto LAB_0162b130;
    }
    ::std::__cxx11::string::_M_assign((string *)type_out);
    type_out->deserializer =
         *(secret_deserializer_t *)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
                 ._M_cur + 0x48);
    ::std::__cxx11::string::_M_assign((string *)&type_out->default_provider);
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)type_out);
    type_out->deserializer =
         *(secret_deserializer_t *)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::SecretType>,_true>
                 ._M_cur + 0x48);
    ::std::__cxx11::string::_M_assign((string *)&type_out->default_provider);
  }
  bVar2 = true;
  ::std::__cxx11::string::_M_assign((string *)&type_out->extension);
LAB_0162b130:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return bVar2;
}

Assistant:

bool SecretManager::TryLookupTypeInternal(const string &type, SecretType &type_out) {
	unique_lock<mutex> lck(manager_lock);
	auto lookup = secret_types.find(type);
	if (lookup != secret_types.end()) {
		type_out = lookup->second;
		return true;
	}

	// Try autoloading
	lck.unlock();
	AutoloadExtensionForType(type);
	lck.lock();

	lookup = secret_types.find(type);
	if (lookup != secret_types.end()) {
		type_out = lookup->second;
		return true;
	}

	return false;
}